

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateBuilderMembers
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  long lVar1;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  
  pFVar3 = this->descriptor_;
  if (((~(byte)pFVar3[1] & 0x60) != 0) &&
     ((((pDVar2 = FieldDescriptor::message_type(pFVar3), pDVar2 != (Descriptor *)0x0 ||
        (((byte)pFVar3[1] & 2) != 0)) || (*(char *)(*(long *)(pFVar3 + 0x10) + 0x3a) == '\x02')) ||
      ((lVar1 = *(long *)(pFVar3 + 0x28), lVar1 != 0 && ((byte)pFVar3[1] & 0x10) != 0 &&
       ((*(int *)(lVar1 + 4) != 1 || ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) == 0)))))))) {
    WriteFieldAccessorDocComment(printer,this->descriptor_,HAZZER,false);
    io::Printer::Print(printer,&this->variables_,
                       "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return instance.has$capitalized_name$();\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  }
  pFVar3 = this->descriptor_;
  if (*(char *)(*(long *)(pFVar3 + 0x10) + 0x3a) == '\x03') {
    WriteFieldEnumValueAccessorDocComment(printer,pFVar3,GETTER,false);
    io::Printer::Print(printer,&this->variables_,
                       "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Value$}$() {\n  return instance.get$capitalized_name$Value();\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldAccessorDocComment(printer,this->descriptor_,SETTER,true);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public Builder ${$set$capitalized_name$Value$}$(int value) {\n  copyOnWrite();\n  instance.set$capitalized_name$Value(value);\n  return this;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    pFVar3 = this->descriptor_;
  }
  WriteFieldAccessorDocComment(printer,pFVar3,GETTER,false);
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  return instance.get$capitalized_name$();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,SETTER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(value);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,CLEARER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  if (HasHazzer(descriptor_)) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return instance.has$capitalized_name$();\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, GETTER);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public int ${$get$capitalized_name$Value$}$() {\n"
        "  return instance.get$capitalized_name$Value();\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                                 /* builder */ true);
    printer->Print(variables_,
                   "$deprecation$public Builder "
                   "${$set$capitalized_name$Value$}$(int value) {\n"
                   "  copyOnWrite();\n"
                   "  instance.set$capitalized_name$Value(value);\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return instance.get$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldEnumValueAccessorDocComment(printer, descriptor_, SETTER,
                                        /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$set$capitalized_name$$}$($type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
}